

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnection.cpp
# Opt level: O0

bool __thiscall FIX::SocketConnection::isValidSession(SocketConnection *this)

{
  bool bVar1;
  SessionID *pSVar2;
  _Self local_188;
  _Self local_180;
  undefined4 local_178;
  undefined1 local_168 [8];
  SessionID sessionID;
  SocketConnection *this_local;
  
  if (this->m_pSession == (Session *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    sessionID.m_frozenString.field_2._8_8_ = this;
    pSVar2 = Session::getSessionID(this->m_pSession);
    SessionID::SessionID((SessionID *)local_168,pSVar2);
    bVar1 = Session::isSessionRegistered((SessionID *)local_168);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      local_180._M_node =
           (_Base_ptr)
           std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::
           find(&this->m_sessions,(key_type *)local_168);
      local_188._M_node =
           (_Base_ptr)
           std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::end
                     (&this->m_sessions);
      bVar1 = std::operator==(&local_180,&local_188);
      this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
    }
    local_178 = 1;
    SessionID::~SessionID((SessionID *)local_168);
  }
  return this_local._7_1_;
}

Assistant:

bool SocketConnection::isValidSession() {
  if (m_pSession == 0) {
    return false;
  }
  SessionID sessionID = m_pSession->getSessionID();
  if (Session::isSessionRegistered(sessionID)) {
    return false;
  }
  return !(m_sessions.find(sessionID) == m_sessions.end());
}